

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_ecdh_api(void)

{
  int iVar1;
  secp256k1_context *seckey;
  secp256k1_pubkey *unaff_retaddr;
  secp256k1_context *in_stack_00000008;
  int32_t ecount;
  uchar s_one [32];
  uchar res [32];
  secp256k1_pubkey point;
  secp256k1_context *tctx;
  void *in_stack_000000d0;
  secp256k1_ecdh_hash_function in_stack_000000d8;
  uchar *in_stack_000000e0;
  secp256k1_pubkey *in_stack_000000e8;
  uchar *in_stack_000000f0;
  secp256k1_context *in_stack_000000f8;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff70;
  int iVar2;
  undefined1 local_88 [4];
  uint in_stack_ffffffffffffff7c;
  
  seckey = secp256k1_context_create(in_stack_ffffffffffffff7c);
  memset(local_88,0,0x20);
  iVar2 = 0;
  secp256k1_context_set_error_callback
            ((secp256k1_context *)(ulong)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (void *)0x14baa0);
  secp256k1_context_set_illegal_callback
            ((secp256k1_context *)CONCAT44(iVar2,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,(void *)0x14bab9);
  iVar1 = secp256k1_ec_pubkey_create(in_stack_00000008,unaff_retaddr,(uchar *)seckey);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x26,"test condition failed: secp256k1_ec_pubkey_create(tctx, &point, s_one) == 1");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x29,"test condition failed: secp256k1_ecdh(tctx, res, &point, s_one, NULL, NULL) == 1"
           );
    abort();
  }
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2a,"test condition failed: ecount == 0");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2b,
            "test condition failed: secp256k1_ecdh(tctx, NULL, &point, s_one, NULL, NULL) == 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2c,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2d,"test condition failed: secp256k1_ecdh(tctx, res, NULL, s_one, NULL, NULL) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2e,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x2f,"test condition failed: secp256k1_ecdh(tctx, res, &point, NULL, NULL, NULL) == 0")
    ;
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x30,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_ecdh(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                         in_stack_000000d8,in_stack_000000d0);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x31,"test condition failed: secp256k1_ecdh(tctx, res, &point, s_one, NULL, NULL) == 1"
           );
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/tests_impl.h"
            ,0x32,"test condition failed: ecount == 3");
    abort();
  }
  secp256k1_context_destroy((secp256k1_context *)CONCAT44(3,in_stack_ffffffffffffff70));
  return;
}

Assistant:

static void test_ecdh_api(void) {
    /* Setup context that just counts errors */
    secp256k1_context *tctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    secp256k1_pubkey point;
    unsigned char res[32];
    unsigned char s_one[32] = { 0 };
    int32_t ecount = 0;
    s_one[31] = 1;

    secp256k1_context_set_error_callback(tctx, counting_illegal_callback_fn, &ecount);
    secp256k1_context_set_illegal_callback(tctx, counting_illegal_callback_fn, &ecount);
    CHECK(secp256k1_ec_pubkey_create(tctx, &point, s_one) == 1);

    /* Check all NULLs are detected */
    CHECK(secp256k1_ecdh(tctx, res, &point, s_one, NULL, NULL) == 1);
    CHECK(ecount == 0);
    CHECK(secp256k1_ecdh(tctx, NULL, &point, s_one, NULL, NULL) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_ecdh(tctx, res, NULL, s_one, NULL, NULL) == 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_ecdh(tctx, res, &point, NULL, NULL, NULL) == 0);
    CHECK(ecount == 3);
    CHECK(secp256k1_ecdh(tctx, res, &point, s_one, NULL, NULL) == 1);
    CHECK(ecount == 3);

    /* Cleanup */
    secp256k1_context_destroy(tctx);
}